

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  _Any_data _Var1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  SDL_Window *pSVar5;
  void *pvVar6;
  long lVar7;
  long *plVar8;
  undefined8 uVar9;
  bool isInitialized;
  _Any_data local_e8;
  _Manager_type local_d8;
  _Invoker_type p_Stack_d0;
  thread worker;
  int playbackId;
  SDL_Window *window;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  _Any_data __tmp;
  _Any_data __tmp_1;
  
  parseCmdArguments_abi_cxx11_((int)&argm,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string((string *)local_e8._M_pod_data,"c",(allocator *)&window);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&argm,(key_type *)&local_e8);
  if (pmVar4->_M_string_length == 0) {
    iVar3 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&worker,"c",(allocator *)&playbackId);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&argm,(key_type *)&worker);
    iVar3 = std::__cxx11::stoi(pmVar4,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&worker);
  }
  std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  captureId = iVar3;
  std::__cxx11::string::string((string *)local_e8._M_pod_data,"p",(allocator *)&window);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&argm,(key_type *)&local_e8);
  if (pmVar4->_M_string_length == 0) {
    iVar3 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&worker,"p",(allocator *)&isInitialized);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&argm,(key_type *)&worker);
    iVar3 = std::__cxx11::stoi(pmVar4,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&worker);
  }
  std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  playbackId = iVar3;
  iVar3 = SDL_Init(0x20);
  __stream = _stderr;
  if (iVar3 == 0) {
    ImGui_PreInit();
    pSVar5 = (SDL_Window *)SDL_CreateWindow("Waver",0x2fff0000,0x2fff0000,400,600,0x2022);
    window = pSVar5;
    pvVar6 = (void *)SDL_GL_CreateContext(pSVar5);
    SDL_GL_MakeCurrent(pSVar5,pvVar6);
    SDL_GL_SetSwapInterval(1);
    ImGui_Init(pSVar5,pvVar6);
    lVar7 = ImGui::GetIO();
    *(undefined8 *)(lVar7 + 0x18) = 0;
    getBinaryPath_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&worker,
                   "DroidSans.ttf");
    bVar2 = ImGui_tryLoadFont((string *)&local_e8,17.5,false);
    std::__cxx11::string::~string((string *)local_e8._M_pod_data);
    std::__cxx11::string::~string((string *)&worker);
    if (!bVar2) {
      getBinaryPath_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&worker,
                     "../bin/DroidSans.ttf");
      bVar2 = ImGui_tryLoadFont((string *)&local_e8,17.5,false);
      std::__cxx11::string::~string((string *)local_e8._M_pod_data);
      std::__cxx11::string::~string((string *)&worker);
      if (!bVar2) {
        getBinaryPath_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&worker,
                       "../examples/assets/fonts/DroidSans.ttf");
        bVar2 = ImGui_tryLoadFont((string *)&local_e8,17.5,false);
        std::__cxx11::string::~string((string *)local_e8._M_pod_data);
        std::__cxx11::string::~string((string *)&worker);
        if (!bVar2) {
          getBinaryPath_abi_cxx11_();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &worker,"../../examples/assets/fonts/DroidSans.ttf");
          ImGui_tryLoadFont((string *)&local_e8,17.5,false);
          std::__cxx11::string::~string((string *)local_e8._M_pod_data);
          std::__cxx11::string::~string((string *)&worker);
        }
      }
    }
    getBinaryPath_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&worker,
                   "fontawesome-webfont.ttf");
    bVar2 = ImGui_tryLoadFont((string *)&local_e8,17.5,true);
    std::__cxx11::string::~string((string *)local_e8._M_pod_data);
    std::__cxx11::string::~string((string *)&worker);
    if (!bVar2) {
      getBinaryPath_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&worker,
                     "../bin/fontawesome-webfont.ttf");
      bVar2 = ImGui_tryLoadFont((string *)&local_e8,17.5,true);
      std::__cxx11::string::~string((string *)local_e8._M_pod_data);
      std::__cxx11::string::~string((string *)&worker);
      if (!bVar2) {
        getBinaryPath_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&worker,
                       "../examples/assets/fonts/fontawesome-webfont.ttf");
        bVar2 = ImGui_tryLoadFont((string *)&local_e8,17.5,true);
        std::__cxx11::string::~string((string *)local_e8._M_pod_data);
        std::__cxx11::string::~string((string *)&worker);
        if (!bVar2) {
          getBinaryPath_abi_cxx11_();
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &worker,"../../examples/assets/fonts/fontawesome-webfont.ttf");
          ImGui_tryLoadFont((string *)&local_e8,17.5,true);
          std::__cxx11::string::~string((string *)local_e8._M_pod_data);
          std::__cxx11::string::~string((string *)&worker);
        }
      }
    }
    ImGui_SetStyle();
    SDL_EventState(0x1000,1);
    ImGui_NewFrame(pSVar5);
    ImGui::Render();
    worker._M_id._M_thread = (id)0;
    isInitialized = false;
    local_d8 = (_Manager_type)0x0;
    p_Stack_d0 = (_Invoker_type)0x0;
    local_e8 = (_Any_data)ZEXT816(0);
    plVar8 = (long *)operator_new(0x20);
    *plVar8 = (long)&playbackId;
    plVar8[1] = (long)&captureId;
    plVar8[2] = (long)&worker;
    plVar8[3] = (long)&isInitialized;
    local_d8 = g_doInit.super__Function_base._M_manager;
    local_e8._M_unused._M_object = plVar8;
    _Var1 = local_e8;
    local_e8 = g_doInit.super__Function_base._M_functor;
    g_doInit.super__Function_base._M_functor = _Var1;
    g_doInit.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:263:16)>
         ::_M_manager;
    p_Stack_d0 = (_Invoker_type)g_doInit._M_invoker;
    g_doInit._M_invoker =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:263:16)>
         ::_M_invoke;
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    local_d8 = g_setWindowSize.super__Function_base._M_manager;
    local_e8._8_8_ = 0;
    local_e8._M_unused._M_function_pointer = (_func_void *)&window;
    _Var1 = local_e8;
    local_e8 = g_setWindowSize.super__Function_base._M_functor;
    g_setWindowSize.super__Function_base._M_functor = _Var1;
    g_setWindowSize.super__Function_base._M_manager =
         std::
         _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:280:23)>
         ::_M_manager;
    p_Stack_d0 = g_setWindowSize._M_invoker;
    g_setWindowSize._M_invoker =
         std::
         _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:280:23)>
         ::_M_invoke;
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    local_d8 = g_mainUpdate.super__Function_base._M_manager;
    local_e8._8_8_ = g_mainUpdate.super__Function_base._M_functor._8_8_;
    local_e8._M_unused._M_object =
         (void *)g_mainUpdate.super__Function_base._M_functor._M_unused._0_8_;
    g_mainUpdate.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:284:20)>
         ::_M_manager;
    p_Stack_d0 = (_Invoker_type)g_mainUpdate._M_invoker;
    g_mainUpdate._M_invoker =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/main.cpp:284:20)>
         ::_M_invoke;
    g_mainUpdate.super__Function_base._M_functor._M_unused._M_object = &isInitialized;
    g_mainUpdate.super__Function_base._M_functor._8_8_ = (allocator *)&window;
    std::_Function_base::~_Function_base((_Function_base *)&local_e8);
    bVar2 = std::function<bool_()>::operator()(&g_doInit);
    if (bVar2) {
      do {
        bVar2 = std::function<bool_()>::operator()(&g_mainUpdate);
      } while (bVar2);
      deinitMain();
      std::thread::join();
      GGWave_deinit();
      ImGui_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      SDL_GL_DeleteContext(pvVar6);
      SDL_DestroyWindow(window);
      SDL_CloseAudio();
      iVar3 = 0;
      SDL_Quit();
    }
    else {
      puts("Error: failed to initialize audio");
      iVar3 = -2;
    }
    std::thread::~thread(&worker);
  }
  else {
    uVar9 = SDL_GetError();
    fprintf(__stream,"Error: %s\n",uVar9);
    iVar3 = -1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&argm);
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#endif

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        fprintf(stderr, "Error: %s\n", SDL_GetError());
        return -1;
    }

    ImGui_PreInit();

    int windowX = 400;
    int windowY = 600;

    // Waver video settings
    //float scale = 0.65;

    //int windowX = scale*570;
    //int windowY = scale*917;

    const char * windowTitle = "Waver";

#ifdef __EMSCRIPTEN__
    SDL_Renderer * renderer;
    SDL_Window * window;
    SDL_CreateWindowAndRenderer(windowX, windowY, SDL_WINDOW_OPENGL, &window, &renderer);
#else
    SDL_WindowFlags window_flags = (SDL_WindowFlags)(SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_ALLOW_HIGHDPI);
    SDL_Window * window = SDL_CreateWindow(windowTitle, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, windowX, windowY, window_flags);
#endif

    void * gl_context = SDL_GL_CreateContext(window);

    SDL_GL_MakeCurrent(window, gl_context);
    SDL_GL_SetSwapInterval(1); // Enable vsync

    ImGui_Init(window, gl_context);
    ImGui::GetIO().IniFilename = nullptr;

    {
        bool isNotLoaded = true;
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../bin/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../examples/assets/fonts/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../../examples/assets/fonts/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
    }

    {
        bool isNotLoaded = true;
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../bin/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../examples/assets/fonts/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../../examples/assets/fonts/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
    }

    ImGui_SetStyle();

    SDL_EventState(SDL_DROPFILE, SDL_ENABLE);

    ImGui_NewFrame(window);
    ImGui::Render();

    // tmp
    //addFile("test0.raw", "test0.raw", std::vector<char>(1024));
    //addFile("test1.jpg", "test0.jpg", std::vector<char>(1024*1024 + 624));
    //addFile("test2.mpv", "test0.mov", std::vector<char>(1024*1024*234 + 53827));

    bool isInitialized = false;
    std::thread worker;

    g_doInit = [&]() {
        if (GGWave_init(playbackId, captureId) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

#ifdef __EMSCRIPTEN__
        initMain();
#else
        worker = initMainAndRunCore();
#endif

        isInitialized = true;

        return true;
    };

    g_setWindowSize = [&](int sizeX, int sizeY) {
        SDL_SetWindowSize(window, sizeX, sizeY);
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        if (ImGui_BeginFrame(window) == false) {
            return false;
        }

        renderMain();
        updateMain();

        ImGui_EndFrame(window);

#ifdef __EMSCRIPTEN__
        updateCore();
#endif

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        if (g_mainUpdate() == false) break;
    }

    deinitMain();
    worker.join();

    GGWave_deinit();

    // Cleanup
    ImGui_Shutdown();
    ImGui::DestroyContext();

    SDL_GL_DeleteContext(gl_context);
    SDL_DestroyWindow(window);
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}